

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int write_ctm(FILE *fh,ps_decoder_t *ps,ps_seg_t *itor,char *uttid,int32 frate)

{
  undefined8 uVar1;
  ps_decoder_t *__stream;
  int iVar2;
  char *pcVar3;
  double dVar4;
  float64 fVar5;
  double dVar6;
  char *local_98;
  char *local_80;
  char *w;
  int32 wid;
  int32 ef;
  int32 sf;
  int32 prob;
  double ustart;
  char *c;
  char *channel;
  char *show;
  char *dupid;
  logmath_t *lmath;
  char *pcStack_28;
  int32 frate_local;
  char *uttid_local;
  ps_seg_t *itor_local;
  ps_decoder_t *ps_local;
  FILE *fh_local;
  
  lmath._4_4_ = frate;
  pcStack_28 = uttid;
  uttid_local = (char *)itor;
  itor_local = (ps_seg_t *)ps;
  ps_local = (ps_decoder_t *)fh;
  dupid = (char *)ps_get_logmath(ps);
  _sf = 0.0;
  if (pcStack_28 == (char *)0x0) {
    local_80 = "(null)";
  }
  else {
    local_80 = pcStack_28;
  }
  channel = __ckd_salloc__(local_80,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                           ,0x25e);
  show = channel;
  pcVar3 = strchr(channel,0x2c);
  if (pcVar3 == (char *)0x0) {
    c = (char *)0x0;
    ustart = 0.0;
  }
  else {
    ustart = (double)(pcVar3 + 1);
    *pcVar3 = '\0';
    c = (char *)ustart;
    pcVar3 = strchr((char *)ustart,0x2c);
    ustart = (double)pcVar3;
    if (pcVar3 != (char *)0x0) {
      ustart = (double)(pcVar3 + 1);
      *pcVar3 = '\0';
      ustart = (double)strchr((char *)ustart,0x2c);
      if ((char *)ustart != (char *)0x0) {
        _sf = atof_c((char *)((long)ustart + 1));
      }
    }
  }
  while (uttid_local != (char *)0x0) {
    pcVar3 = ps_seg_word((ps_seg_t *)uttid_local);
    w._0_4_ = dict_wordid(*(dict_t **)&itor_local->sf,pcVar3);
    if ((-1 < (s3wid_t)w) &&
       (iVar2 = dict_real_word(*(dict_t **)&itor_local->sf,(s3wid_t)w), iVar2 != 0)) {
      ef = ps_seg_prob((ps_seg_t *)uttid_local,(int32 *)0x0,(int32 *)0x0,(int32 *)0x0);
      ps_seg_frames((ps_seg_t *)uttid_local,&wid,(int *)((long)&w + 4));
      __stream = ps_local;
      pcVar3 = channel;
      if (c == (char *)0x0) {
        local_98 = "1";
      }
      else {
        local_98 = c;
      }
      dVar4 = _sf + (double)wid / (double)lmath._4_4_;
      iVar2 = w._4_4_ - wid;
      dVar6 = (double)lmath._4_4_;
      uVar1 = *(undefined8 *)
               (*(long *)(*(long *)&itor_local->sf + 0x10) +
               (long)*(int *)(*(long *)(*(long *)&itor_local->sf + 0x10) + (long)(s3wid_t)w * 0x20 +
                             0x18) * 0x20);
      fVar5 = logmath_exp((logmath_t *)dupid,ef);
      fprintf((FILE *)__stream,"%s %s %.2f %.2f %s %.3f\n",dVar4,(double)iVar2 / dVar6,fVar5,pcVar3,
              local_98,uVar1);
    }
    uttid_local = (char *)ps_seg_next((ps_seg_t *)uttid_local);
  }
  ckd_free(show);
  return 0;
}

Assistant:

static int
write_ctm(FILE *fh, ps_decoder_t *ps, ps_seg_t *itor, char const *uttid, int32 frate)
{
    logmath_t *lmath = ps_get_logmath(ps);
    char *dupid, *show, *channel, *c;
    double ustart = 0.0;

    /* We have semi-standardized on comma-separated uttids which
     * correspond to the fields of the STM file.  So if there's a
     * comma in the uttid, take the first two fields as show and
     * channel, and also try to find the start time. */
    show = dupid = ckd_salloc(uttid ? uttid : "(null)");
    if ((c = strchr(dupid, ',')) != NULL) {
        *c++ = '\0';
        channel = c;
        if ((c = strchr(c, ',')) != NULL) {
            *c++ = '\0';
            if ((c = strchr(c, ',')) != NULL) {
                ustart = atof_c(c + 1);
            }
        }
    }
    else {
        channel = NULL;
    }

    while (itor) {
        int32 prob, sf, ef, wid;
        char const *w;

        /* Skip things that aren't "real words" (FIXME: currently
         * requires s3kr3t h34d3rz...) */
        w = ps_seg_word(itor);
        wid = dict_wordid(ps->dict, w);
        if (wid >= 0 && dict_real_word(ps->dict, wid)) {
            prob = ps_seg_prob(itor, NULL, NULL, NULL);
            ps_seg_frames(itor, &sf, &ef);
        
            fprintf(fh, "%s %s %.2f %.2f %s %.3f\n",
                    show,
                    channel ? channel : "1",
                    ustart + (double)sf / frate,
                    (double)(ef - sf) / frate,
                    /* FIXME: More s3kr3tz */
                    dict_basestr(ps->dict, wid),
                    logmath_exp(lmath, prob));
        }
        itor = ps_seg_next(itor);
    }
    ckd_free(dupid);

    return 0;
}